

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O1

void Llb_ManGroupStop(Llb_Grp_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  
  if (p == (Llb_Grp_t *)0x0) {
    return;
  }
  iVar1 = p->Id;
  if ((-1 < (long)iVar1) && (pVVar2 = p->pMan->vGroups, iVar1 < pVVar2->nSize)) {
    pVVar2->pArray[iVar1] = (void *)0x0;
    if (p->vIns != (Vec_Ptr_t *)0x0) {
      ppvVar3 = p->vIns->pArray;
      if (ppvVar3 != (void **)0x0) {
        free(ppvVar3);
        p->vIns->pArray = (void **)0x0;
      }
      if (p->vIns != (Vec_Ptr_t *)0x0) {
        free(p->vIns);
        p->vIns = (Vec_Ptr_t *)0x0;
      }
    }
    if (p->vOuts != (Vec_Ptr_t *)0x0) {
      ppvVar3 = p->vOuts->pArray;
      if (ppvVar3 != (void **)0x0) {
        free(ppvVar3);
        p->vOuts->pArray = (void **)0x0;
      }
      if (p->vOuts != (Vec_Ptr_t *)0x0) {
        free(p->vOuts);
        p->vOuts = (Vec_Ptr_t *)0x0;
      }
    }
    if (p->vNodes != (Vec_Ptr_t *)0x0) {
      ppvVar3 = p->vNodes->pArray;
      if (ppvVar3 != (void **)0x0) {
        free(ppvVar3);
        p->vNodes->pArray = (void **)0x0;
      }
      if (p->vNodes != (Vec_Ptr_t *)0x0) {
        free(p->vNodes);
        p->vNodes = (Vec_Ptr_t *)0x0;
      }
    }
    free(p);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

void Llb_ManGroupStop( Llb_Grp_t * p )
{
    if ( p == NULL )
        return;
    Vec_PtrWriteEntry( p->pMan->vGroups, p->Id, NULL );
    Vec_PtrFreeP( &p->vIns );
    Vec_PtrFreeP( &p->vOuts );
    Vec_PtrFreeP( &p->vNodes );
    ABC_FREE( p );
}